

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O2

void __thiscall
UtilityTest_Unpack16Test_Test::UtilityTest_Unpack16Test_Test(UtilityTest_Unpack16Test_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00146a40;
  return;
}

Assistant:

TEST(UtilityTest, Unpack16Test) {
    // Test case 1: Unpacking two bytes from a single byte array
    uint8_t data1[] = {0xAB, 0xCD};
    uint16_t result1 = Unpack16(data1, 0);
    EXPECT_EQ(result1, 0xABCD);

    // Test case 2: Unpacking two bytes at a non-zero offset
    uint8_t data2[] = {0x12, 0x34, 0x56, 0x78};
    uint16_t result2 = Unpack16(data2, 1);
    EXPECT_EQ(result2, 0x3456);

    // Test case 3: Unpacking two bytes from a larger array
    uint8_t data3[] = {0x11, 0x22, 0x33, 0x44, 0x55, 0x66};
    uint16_t result3 = Unpack16(data3, 3);
    EXPECT_EQ(result3, 0x4455);
}